

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O0

bool __thiscall QNetworkCookieJar::deleteCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  bool bVar1;
  anon_class_8_1_5063fba2_for__M_pred __pred;
  const_iterator o;
  const_iterator in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  QNetworkCookieJarPrivate *d;
  const_iterator it;
  QList<QNetworkCookie> *in_stack_ffffffffffffffa0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __pred.cookie = (QNetworkCookie *)d_func((QNetworkCookieJar *)0x1c0eaa);
  local_10.i = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  QList<QNetworkCookie>::cbegin(in_stack_ffffffffffffffa0);
  QList<QNetworkCookie>::cend(in_stack_ffffffffffffffa0);
  local_10 = std::
             find_if<QList<QNetworkCookie>::const_iterator,QNetworkCookieJar::deleteCookie(QNetworkCookie_const&)::__0>
                       (in_RDI,in_RSI,__pred);
  o = QList<QNetworkCookie>::cend(in_stack_ffffffffffffffa0);
  bVar1 = QList<QNetworkCookie>::const_iterator::operator!=(&local_10,o);
  if (bVar1) {
    QList<QNetworkCookie>::erase((QList<QNetworkCookie> *)in_RSI.i,(const_iterator)__pred.cookie);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QNetworkCookieJar::deleteCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const auto it = std::find_if(d->allCookies.cbegin(), d->allCookies.cend(),
                                 [&cookie](const auto &c) { return c.hasSameIdentifier(cookie); });
    if (it != d->allCookies.cend()) {
        d->allCookies.erase(it);
        return true;
    }
    return false;
}